

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::_process_callbacks(App *this)

{
  bool bVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pcVar4;
  pointer puVar5;
  Option *this_00;
  App *this_01;
  size_t sVar6;
  Option_p *opt;
  pointer puVar7;
  pointer psVar8;
  App_p *sub;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  psVar8 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar2) {
    do {
      peVar3 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pcVar4 = (peVar3->name_)._M_dataplus._M_p;
      local_50 = local_40;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + (peVar3->name_)._M_string_length);
      if (local_48 == 0) {
        bVar1 = ((psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                immediate_callback_;
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if (bVar1 != false) {
          sVar6 = count_all((psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
          if (sVar6 != 0) {
            _process_callbacks((psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
            run_callback((psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          }
        }
      }
      else if (local_50 != local_40) {
        operator_delete(local_50);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar2);
  }
  puVar5 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar5; puVar7 = puVar7 + 1) {
    this_00 = (puVar7->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
              _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((*(pointer *)
          ((long)&(this_00->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          + 8) != (this_00->results_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) && (this_00->callback_run_ == false)) {
      Option::run_callback(this_00);
    }
  }
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar8 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar2; psVar8 = psVar8 + 1) {
    this_01 = (psVar8->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (this_01->immediate_callback_ == false) {
      _process_callbacks(this_01);
    }
  }
  return;
}

Assistant:

void _process_callbacks() {

        for(App_p &sub : subcommands_) {
            // process the priority option_groups first
            if(sub->get_name().empty() && sub->immediate_callback_) {
                if(sub->count_all() > 0) {
                    sub->_process_callbacks();
                    sub->run_callback();
                }
            }
        }

        for(const Option_p &opt : options_) {
            if(opt->count() > 0 && !opt->get_callback_run()) {
                opt->run_callback();
            }
        }

        for(App_p &sub : subcommands_) {
            if(!sub->immediate_callback_) {
                sub->_process_callbacks();
            }
        }
    }